

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O1

int SHA1_Init(SHA_CTX *c)

{
  c->h0 = 0x67452301;
  c->h1 = 0xefcdab89;
  c->h2 = 0x98badcfe;
  c->h3 = 0x10325476;
  c->h4 = 0xc3d2e1f0;
  c->Nl = 0;
  c->Nh = 0;
  return -0x3c2d1e10;
}

Assistant:

void SHA1_Init(SHA1_CTX *context) {
  /* SHA1 initialization constants */
  context->state[0] = 0x67452301;
  context->state[1] = 0xEFCDAB89;
  context->state[2] = 0x98BADCFE;
  context->state[3] = 0x10325476;
  context->state[4] = 0xC3D2E1F0;
  context->count[0] = context->count[1] = 0;
}